

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O1

cx_string<188UL> * __thiscall
mserialize::cx_strcat<1ul,100ul,86ul,1ul>
          (cx_string<188UL> *__return_storage_ptr__,mserialize *this,cx_string<1UL> *strings,
          cx_string<100UL> *strings_1,cx_string<86UL> *strings_2,cx_string<1UL> *strings_3)

{
  size_t i;
  long lVar1;
  ulong uVar2;
  undefined1 *__s;
  size_t size [5];
  char *data [5];
  char buffer [189];
  ulong local_158 [6];
  char *local_128;
  mserialize *local_120;
  cx_string<1UL> *local_118;
  cx_string<100UL> *local_110;
  cx_string<86UL> *local_108;
  undefined1 local_f8 [200];
  
  __s = local_f8;
  memset(__s,0,0xbd);
  local_128 = "";
  local_120 = this;
  local_118 = strings;
  local_110 = strings_1;
  local_108 = strings_2;
  local_158[0] = 0;
  lVar1 = 1;
  local_158[1] = 1;
  local_158[2] = 100;
  local_158[3] = 0x56;
  local_158[4] = 1;
  do {
    if (local_158[lVar1] != 0) {
      uVar2 = 0;
      do {
        __s[uVar2] = (&local_128)[lVar1][uVar2];
        uVar2 = uVar2 + 1;
      } while (uVar2 < local_158[lVar1]);
      __s = __s + uVar2;
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  __return_storage_ptr__->_data[0xbc] = '\0';
  memcpy(__return_storage_ptr__,local_f8,0xbc);
  return __return_storage_ptr__;
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}